

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list_handler.c
# Opt level: O2

ion_cursor_status_t sldict_next(ion_dict_cursor_t *cursor,ion_record_t *record)

{
  ion_boolean_t iVar1;
  ion_cursor_status_t iVar2;
  
  iVar2 = cursor->status;
  switch(iVar2) {
  case '\x01':
  case '\x03':
    goto switchD_0010aba4_caseD_1;
  case '\x02':
    cursor->status = '\x04';
    break;
  case '\x04':
    if ((*(undefined8 **)(cursor + 1) == (undefined8 *)0x0) ||
       (iVar1 = test_predicate(cursor,(ion_key_t)**(undefined8 **)(cursor + 1)), iVar1 == '\0')) {
      cursor->status = '\x01';
      return '\x01';
    }
    break;
  default:
    iVar2 = '\0';
    goto switchD_0010aba4_caseD_1;
  }
  memcpy(record->key,(void *)**(undefined8 **)(cursor + 1),
         (long)(cursor->dictionary->instance->record).key_size);
  memcpy(record->value,*(void **)(*(long *)(cursor + 1) + 8),
         (long)(cursor->dictionary->instance->record).value_size);
  *(undefined8 *)(cursor + 1) = **(undefined8 **)(*(long *)(cursor + 1) + 0x18);
  iVar2 = cursor->status;
switchD_0010aba4_caseD_1:
  return iVar2;
}

Assistant:

ion_cursor_status_t
sldict_next(
	ion_dict_cursor_t	*cursor,
	ion_record_t		*record
) {
	ion_sldict_cursor_t *sl_cursor = (ion_sldict_cursor_t *) cursor;

	if (cursor->status == cs_cursor_uninitialized) {
		return cursor->status;
	}
	else if (cursor->status == cs_end_of_results) {
		return cursor->status;
	}
	else if ((cursor->status == cs_cursor_initialized) || (cursor->status == cs_cursor_active)) {
		if (cursor->status == cs_cursor_active) {
			if ((NULL == sl_cursor->current) || (test_predicate(cursor, sl_cursor->current->key) == boolean_false)) {
				cursor->status = cs_end_of_results;
				return cursor->status;
			}
		}
		else {
			/* The status is cs_cursor_initialized */
			cursor->status = cs_cursor_active;
		}

		/*Copy both key and value into user provided struct */
		memcpy(record->key, sl_cursor->current->key, cursor->dictionary->instance->record.key_size);
		memcpy(record->value, sl_cursor->current->value, cursor->dictionary->instance->record.value_size);

		sl_cursor->current = sl_cursor->current->next[0];
		return cursor->status;
	}

	return cs_invalid_cursor;
}